

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b)

{
  AlphaNum *x2;
  size_t sVar1;
  AlphaNum *in_RDX;
  AlphaNum *in_RSI;
  char *in_RDI;
  char *out;
  char *begin;
  size_type old_size;
  AlphaNum *x1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  reference local_b8;
  AlphaNum *local_b0;
  AlphaNum *local_18;
  AlphaNum *local_10;
  char *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  x2 = (AlphaNum *)std::__cxx11::string::size();
  local_b0 = x2;
  sVar1 = strings::AlphaNum::size(local_10);
  x1 = (AlphaNum *)(x2->digits + (sVar1 - 0x10));
  strings::AlphaNum::size(local_18);
  std::__cxx11::string::resize((ulong)local_8);
  local_c0._M_current = (char *)std::__cxx11::string::begin();
  local_b8 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_c0);
  Append2(local_8,x1,x2);
  return;
}

Assistant:

void StrAppend(string *result, const AlphaNum &a, const AlphaNum &b) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size());
  char *const begin = &*result->begin();
  char *out = Append2(begin + old_size, a, b);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}